

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

bool __thiscall argparse::Argument::is_decimal_literal(Argument *this,string_view s)

{
  byte *pbVar1;
  byte bVar2;
  char *pcVar3;
  Argument *pAVar4;
  byte *pbVar5;
  Argument *pAVar6;
  
  pbVar5 = (byte *)s._M_len;
  if (this == (Argument *)0x0) {
    return false;
  }
  bVar2 = *pbVar5;
  if (bVar2 - 0x31 < 9) {
    pcVar3 = std::
             __find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<argparse::Argument::is_decimal_literal(std::basic_string_view<char,std::char_traits<char>>)::_lambda(auto:1)_1_>>
                       (pbVar5,pbVar5 + (long)this,s._M_str);
    pAVar4 = (Argument *)(pcVar3 + -(long)pbVar5);
    pAVar6 = this;
    if (this < pAVar4) goto LAB_0011e978;
    pAVar6 = (Argument *)((long)this - (long)pAVar4);
    if (pAVar6 == (Argument *)0x0) {
      return true;
    }
    pbVar5 = pbVar5 + (long)pAVar4;
LAB_0011e82e:
    bVar2 = *pbVar5;
    if ((bVar2 != 0x65) && (bVar2 != 0x45)) {
      if (bVar2 != 0x2e) {
        return false;
      }
      pAVar6 = (Argument *)((long)&pAVar6[-1].m_prefix_chars._M_str + 7);
      if (pAVar6 == (Argument *)0x0) {
        return true;
      }
      bVar2 = pbVar5[1];
      pbVar5 = pbVar5 + 1;
      if (bVar2 - 0x30 < 10) goto LAB_0011e8d6;
      goto LAB_0011e8f8;
    }
  }
  else {
    if (bVar2 != 0x2e) {
      if (bVar2 != 0x30) {
        return false;
      }
      pAVar6 = (Argument *)((long)&this[-1].m_prefix_chars._M_str + 7);
      if (pAVar6 == (Argument *)0x0) {
        return true;
      }
      pbVar1 = pbVar5 + 1;
      pcVar3 = std::
               __find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<argparse::Argument::is_decimal_literal(std::basic_string_view<char,std::char_traits<char>>)::_lambda(auto:1)_1_>>
                         (pbVar1,pbVar5 + (long)&this->m_names,s._M_str);
      pAVar4 = (Argument *)(pcVar3 + -(long)pbVar1);
      if (pAVar6 < pAVar4) goto LAB_0011e978;
      pAVar6 = (Argument *)((long)pAVar6 - (long)pAVar4);
      if (pAVar6 == (Argument *)0x0) {
        return false;
      }
      pbVar5 = pbVar1 + (long)pAVar4;
      goto LAB_0011e82e;
    }
    pAVar6 = (Argument *)((long)&this[-1].m_prefix_chars._M_str + 7);
    if (pAVar6 == (Argument *)0x0) {
      return false;
    }
    if (9 < pbVar5[1] - 0x30) {
      return false;
    }
    pbVar5 = pbVar5 + 1;
LAB_0011e8d6:
    pcVar3 = std::
             __find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<argparse::Argument::is_decimal_literal(std::basic_string_view<char,std::char_traits<char>>)::_lambda(auto:1)_1_>>
                       (pbVar5,pbVar5 + (long)pAVar6);
    pAVar4 = (Argument *)(pcVar3 + -(long)pbVar5);
    if (pAVar6 < pAVar4) goto LAB_0011e978;
    if ((Argument *)((long)pAVar6 - (long)pAVar4) == (Argument *)0x0) {
      return true;
    }
    bVar2 = pbVar5[(long)pAVar4];
    pbVar5 = pbVar5 + (long)pAVar4;
    pAVar6 = (Argument *)((long)pAVar6 - (long)pAVar4);
LAB_0011e8f8:
    if ((bVar2 | 0x20) != 0x65) {
      return false;
    }
  }
  pAVar4 = (Argument *)((long)&pAVar6[-1].m_prefix_chars._M_str + 7);
  if (pAVar4 != (Argument *)0x0) {
    bVar2 = pbVar5[1];
    if ((bVar2 == 0x2d) || (bVar2 == 0x2b)) {
      pAVar6 = (Argument *)((long)&pAVar6[-1].m_prefix_chars._M_str + 6);
      if (pAVar6 == (Argument *)0x0) {
        return false;
      }
      bVar2 = pbVar5[2];
      pbVar5 = pbVar5 + 2;
    }
    else {
      pbVar5 = pbVar5 + 1;
      pAVar6 = pAVar4;
    }
    if (bVar2 - 0x30 < 10) {
      pcVar3 = std::
               __find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<argparse::Argument::is_decimal_literal(std::basic_string_view<char,std::char_traits<char>>)::_lambda(auto:1)_1_>>
                         (pbVar5,pbVar5 + (long)pAVar6);
      pAVar4 = (Argument *)(pcVar3 + -(long)pbVar5);
      if (pAVar4 <= pAVar6) {
        return pAVar4 == pAVar6;
      }
LAB_0011e978:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 pAVar4,pAVar6);
    }
  }
  return false;
}

Assistant:

inline auto do_from_chars(std::string_view s) -> T {
  T x;
  auto [first, last] = pointer_range(s);
  auto [ptr, ec] = std::from_chars(first, last, x, Param);
  if (ec == std::errc()) {
    if (ptr == last) {
      return x;
    }
    throw std::invalid_argument{"pattern '" + std::string(s) +
                                "' does not match to the end"};
  }
  if (ec == std::errc::invalid_argument) {
    throw std::invalid_argument{"pattern '" + std::string(s) + "' not found"};
  }
  if (ec == std::errc::result_out_of_range) {
    throw std::range_error{"'" + std::string(s) + "' not representable"};
  }
  return x; // unreachable
}